

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_433838::SpotController::collective_flush
          (SpotController *this,OutputStream *stream,Comm *comm)

{
  bool bVar1;
  StreamType SVar2;
  int iVar3;
  ostream *poVar4;
  ChannelBody *chB;
  size_t sVar5;
  string local_730;
  Log local_710;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_508;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_4f0;
  vector<cali::Entry,_std::allocator<cali::Entry>_> local_4d8;
  undefined1 local_4c0 [8];
  CaliWriter writer;
  Caliper c;
  string local_480;
  Log local_460;
  string local_258;
  Log local_228;
  Comm *local_20;
  Comm *comm_local;
  OutputStream *stream_local;
  SpotController *this_local;
  
  local_20 = comm;
  comm_local = (Comm *)stream;
  stream_local = (OutputStream *)this;
  bVar1 = cali::ChannelController::is_instantiated((ChannelController *)this);
  if (bVar1) {
    cali::Log::Log(&local_460,1);
    poVar4 = cali::Log::stream(&local_460);
    cali::ChannelController::name_abi_cxx11_(&local_480,(ChannelController *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_480);
    poVar4 = std::operator<<(poVar4,": Flushing Caliper data");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_480);
    cali::Log::~Log(&local_460);
    SVar2 = cali::OutputStream::type((OutputStream *)comm_local);
    if (SVar2 == None) {
      create_output_stream((SpotController *)&c.m_is_signal);
      cali::OutputStream::operator=((OutputStream *)comm_local,(OutputStream *)&c.m_is_signal);
      cali::OutputStream::~OutputStream((OutputStream *)&c.m_is_signal);
    }
    cali::Caliper::Caliper
              ((Caliper *)
               &writer.mP.
                super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cali::CaliWriter::CaliWriter((CaliWriter *)local_4c0,(OutputStream *)comm_local);
    flush_regionprofile(this,(Caliper *)
                             &writer.mP.
                              super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,(CaliWriter *)local_4c0,local_20);
    bVar1 = cali::ConfigManager::Options::is_enabled(&this->m_opts,"timeseries");
    if (bVar1) {
      flush_timeseries(this,(Caliper *)
                            &writer.mP.
                             super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,(CaliWriter *)local_4c0,local_20);
    }
    iVar3 = (*local_20->_vptr_Comm[2])();
    if (iVar3 == 0) {
      chB = cali::ChannelController::channel_body((ChannelController *)this);
      cali::Caliper::get_globals
                (&local_4f0,
                 (Caliper *)
                 &writer.mP.
                  super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,chB);
      cali::CaliperMetadataDB::import_globals
                (&local_4d8,&this->m_db,
                 (CaliperMetadataAccessInterface *)
                 &writer.mP.
                  super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_4f0);
      std::vector<cali::Entry,_std::allocator<cali::Entry>_>::~vector
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_4d8);
      std::vector<cali::Entry,_std::allocator<cali::Entry>_>::~vector(&local_4f0);
      save_spot_metadata(this);
      cali::CaliperMetadataDB::get_globals(&local_508,&this->m_db);
      cali::CaliWriter::write_globals
                ((CaliWriter *)local_4c0,&(this->m_db).super_CaliperMetadataAccessInterface,
                 (vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_508);
      std::vector<cali::Entry,_std::allocator<cali::Entry>_>::~vector
                ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&local_508);
      cali::Log::Log(&local_710,1);
      poVar4 = cali::Log::stream(&local_710);
      cali::ChannelController::name_abi_cxx11_(&local_730,(ChannelController *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_730);
      poVar4 = std::operator<<(poVar4,": Wrote ");
      sVar5 = cali::CaliWriter::num_written((CaliWriter *)local_4c0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
      poVar4 = std::operator<<(poVar4," records.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_730);
      cali::Log::~Log(&local_710);
    }
    cali::CaliWriter::~CaliWriter((CaliWriter *)local_4c0);
    cali::Caliper::~Caliper
              ((Caliper *)
               &writer.mP.
                super___shared_ptr<cali::CaliWriter::CaliWriterImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    cali::Log::Log(&local_228,0);
    poVar4 = cali::Log::stream(&local_228);
    cali::ChannelController::name_abi_cxx11_(&local_258,(ChannelController *)this);
    poVar4 = std::operator<<(poVar4,(string *)&local_258);
    std::operator<<(poVar4,": SpotController: channel not instantiated\n");
    std::__cxx11::string::~string((string *)&local_258);
    cali::Log::~Log(&local_228);
  }
  return;
}

Assistant:

void collective_flush(OutputStream& stream, Comm& comm) override
    {
        if (!is_instantiated()) {
            Log(0).stream() << name() << ": SpotController: channel not instantiated\n";
            return;
        }

        Log(1).stream() << name() << ": Flushing Caliper data" << std::endl;

        if (stream.type() == OutputStream::None)
            stream = create_output_stream();

        Caliper    c;
        CaliWriter writer(stream);

        flush_regionprofile(c, writer, comm);

        if (m_opts.is_enabled("timeseries"))
            flush_timeseries(c, writer, comm);

        if (comm.rank() == 0) {
            m_db.import_globals(c, c.get_globals(channel_body()));
            save_spot_metadata();
            writer.write_globals(m_db, m_db.get_globals());

            Log(1).stream() << name() << ": Wrote " << writer.num_written() << " records." << std::endl;
        }
    }